

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  CallLogWrapper *this_00;
  pointer pBVar1;
  uint uVar2;
  pointer pcVar3;
  ulong uVar4;
  pointer pVVar5;
  string *psVar6;
  GLint location;
  int iVar7;
  int iVar8;
  uint size;
  DataType DVar9;
  deUint32 dVar10;
  GLenum GVar11;
  pointer pBVar12;
  long *plVar13;
  undefined8 *puVar14;
  size_t sVar15;
  bool bVar16;
  DataType scalarType;
  ulong *puVar17;
  long *plVar18;
  pointer pBVar19;
  VarValue *value;
  VarValue *value_00;
  pointer pBVar20;
  VarValue *pVVar21;
  undefined8 uVar22;
  char *pcVar23;
  ulong uVar24;
  DataType *pDVar25;
  undefined4 *puVar26;
  _Alloc_hider _Var27;
  uint uVar28;
  uint uVar29;
  GLsizei GVar30;
  long lVar31;
  byte bVar32;
  float fVar33;
  string curName;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  VarValue apiValue;
  string queryName;
  VarValue result_2;
  vector<float,_std::allocator<float>_> buffer;
  string local_330;
  UniformCase *local_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  TestLog *local_2e8;
  deUint32 local_2e0;
  int local_2dc;
  vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
  local_2d8;
  undefined1 local_2c0 [4];
  float afStack_2bc [3];
  ulong local_2b0 [7];
  undefined8 local_278;
  undefined8 local_270;
  long local_268;
  undefined8 uStack_260;
  long *local_230 [2];
  long local_220 [2];
  string local_210 [2];
  long local_1c8;
  undefined8 *local_1c0;
  string *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [104];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  bVar32 = 0;
  uVar2 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
  scalarType = TYPE_INT;
  if ((uVar2 & 0x20) == 0) {
    scalarType = TYPE_FLOAT;
  }
  pBVar12 = (basicUniforms->
            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3) *
          0x286bca1b) {
    local_2e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &this->super_CallLogWrapper;
    local_1c8 = 0;
    local_310 = this;
    local_2e0 = programGL;
    do {
      pBVar1 = pBVar12 + local_1c8;
      iVar7 = pBVar12[local_1c8].elemNdx;
      if ((((local_310->super_CallLogWrapper).field_0x14 & 0x80) == 0) || (iVar7 != 0)) {
        local_230[0] = local_220;
        pcVar3 = (pBVar1->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,pcVar3,pcVar3 + (pBVar1->name)._M_string_length);
        if (-1 < iVar7) goto LAB_00f7d095;
        uVar28 = 1;
LAB_00f7d16e:
        location = glu::CallLogWrapper::glGetUniformLocation
                             (this_00,local_2e0,(GLchar *)local_230[0]);
        local_2dc = iVar7;
        iVar7 = glu::getDataTypeScalarSize(pBVar1->type);
        uVar29 = 0;
        bVar16 = false;
        if (((local_310->super_CallLogWrapper).field_0x14 & 2) != 0) {
          bVar16 = uVar28 == 1 &&
                   (pBVar1->type - TYPE_INT < 0xfffffff7 && pBVar1->type - TYPE_DOUBLE < 0xfffffff7)
          ;
        }
        local_2d8.
        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2d8.
        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2d8.
        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1b8 = &pBVar1->rootName;
        local_1c0 = (undefined8 *)((long)&(pBVar1->finalValue).val + 4);
        do {
          psVar6 = local_1b8;
          if (local_2dc < 0) {
            local_308 = &local_2f8;
            pcVar3 = (pBVar1->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_308,pcVar3,pcVar3 + (pBVar1->name)._M_string_length);
            pBVar12 = pBVar1;
LAB_00f7d51e:
            pVVar21 = &pBVar12->finalValue;
            pDVar25 = (DataType *)&local_278;
            for (lVar31 = 0x11; lVar31 != 0; lVar31 = lVar31 + -1) {
              *pDVar25 = pVVar21->type;
              pVVar21 = (VarValue *)((long)pVVar21 + (ulong)bVar32 * -8 + 4);
              pDVar25 = pDVar25 + (ulong)bVar32 * -2 + 1;
            }
            if ((DataType)local_278 - TYPE_BOOL < 4) {
              size = glu::getDataTypeScalarSize((DataType)local_278);
              if (size == 1) {
                _local_2c0 = (ulong *)CONCAT44(afStack_2bc[0],scalarType);
                if ((uVar2 & 0x20) == 0) {
LAB_00f7d5c6:
                  uVar24 = 0;
                  do {
                    if (*(char *)((long)&local_278 + uVar24 + 4) == '\x01') {
                      fVar33 = deRandom_getFloat(&rnd->m_rnd);
                      fVar33 = fVar33 * 20.0 + -10.0;
                      *(float *)(local_2c0 + uVar24 * 4 + 4) = fVar33;
                      if ((fVar33 == 0.0) && (!NAN(fVar33))) {
                        *(undefined4 *)(local_2c0 + uVar24 * 4 + 4) = 0x3f800000;
                      }
                    }
                    else {
                      *(undefined4 *)(local_2c0 + uVar24 * 4 + 4) = 0;
                    }
                    uVar24 = uVar24 + 1;
                  } while (size != uVar24);
                }
                else {
LAB_00f7d626:
                  uVar24 = 0;
                  do {
                    if (*(char *)((long)&local_278 + uVar24 + 4) == '\x01') {
                      dVar10 = deRandom_getUint32(&rnd->m_rnd);
                      *(uint *)(local_2c0 + uVar24 * 4 + 4) =
                           (dVar10 % 0x15 - 10) + (uint)(dVar10 % 0x15 == 10);
                    }
                    else {
                      *(undefined4 *)(local_2c0 + uVar24 * 4 + 4) = 0;
                    }
                    uVar24 = uVar24 + 1;
                  } while (size != uVar24);
                }
              }
              else {
                DVar9 = glu::getDataTypeVector(scalarType,size);
                _local_2c0 = (ulong *)CONCAT44(afStack_2bc[0],DVar9);
                if ((uVar2 & 0x20) == 0) {
                  if (0 < (int)size) goto LAB_00f7d5c6;
                }
                else if (0 < (int)size) goto LAB_00f7d626;
              }
            }
            else if ((DataType)local_278 - TYPE_SAMPLER_1D < 0x1e) {
              _local_2c0 = (ulong *)CONCAT44(local_278._4_4_,0x1b);
            }
            else {
              puVar14 = &local_278;
              puVar26 = (undefined4 *)local_2c0;
              for (lVar31 = 0x11; lVar31 != 0; lVar31 = lVar31 + -1) {
                *puVar26 = *(undefined4 *)puVar14;
                puVar14 = (undefined8 *)((long)puVar14 + (ulong)bVar32 * -8 + 4);
                puVar26 = puVar26 + (ulong)bVar32 * -2 + 1;
              }
            }
            std::
            vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
            ::push_back(&local_2d8,(value_type *)local_2c0);
            if (pBVar1->type - TYPE_BOOL < 4) {
              local_1b0 = (undefined1  [8])local_2e8;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"// Using type ",0xe);
              pcVar23 = glu::getDataTypeName(scalarType);
              if (pcVar23 == (char *)0x0) {
                std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
              }
              else {
                sVar15 = strlen(pcVar23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar23,sVar15);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," to set boolean value ",0x16);
              apiVarValueStr_abi_cxx11_(local_210,(Functional *)&local_278,value_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         (char *)CONCAT44(local_210[0]._M_dataplus._M_p._4_4_,
                                          local_210[0]._M_dataplus._M_p._0_4_),
                         CONCAT44(local_210[0]._M_string_length._4_4_,
                                  (undefined4)local_210[0]._M_string_length));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," for ",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_308,local_300);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_210[0]._M_dataplus._M_p._4_4_,
                              local_210[0]._M_dataplus._M_p._0_4_) != &local_210[0].field_2) {
                uVar22 = CONCAT44(local_210[0].field_2._M_allocated_capacity._4_4_,
                                  (undefined4)local_210[0].field_2._M_allocated_capacity);
                _Var27._M_p = (char *)CONCAT44(local_210[0]._M_dataplus._M_p._4_4_,
                                               local_210[0]._M_dataplus._M_p._0_4_);
LAB_00f7d8c2:
                operator_delete(_Var27._M_p,uVar22 + 1);
              }
            }
            else {
              if (0x1d < pBVar1->type - TYPE_SAMPLER_1D) goto LAB_00f7d8eb;
              local_1b0 = (undefined1  [8])local_2e8;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"// Texture for the sampler uniform ",0x23);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_308,local_300);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," will be filled with color ",0x1b);
              local_210[0]._M_dataplus._M_p._0_4_ = 4;
              local_210[0]._M_dataplus._M_p._4_4_ = (undefined4)*local_1c0;
              local_210[0]._M_string_length._0_4_ = (undefined4)((ulong)*local_1c0 >> 0x20);
              local_210[0]._M_string_length._4_4_ = (undefined4)local_1c0[1];
              local_210[0].field_2._M_allocated_capacity._0_4_ =
                   (undefined4)((ulong)local_1c0[1] >> 0x20);
              apiVarValueStr_abi_cxx11_(&local_330,(Functional *)local_210,value);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_330._M_dataplus._M_p,local_330._M_string_length)
              ;
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              uVar22 = local_330.field_2._M_allocated_capacity;
              _Var27._M_p = local_330._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) goto LAB_00f7d8c2;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          else {
            std::__cxx11::string::rfind((char)local_1b8,0x5b);
            std::__cxx11::string::substr((ulong)local_210,(ulong)psVar6);
            plVar13 = (long *)std::__cxx11::string::append((char *)local_210);
            _local_2c0 = local_2b0;
            puVar17 = (ulong *)(plVar13 + 2);
            if ((ulong *)*plVar13 == puVar17) {
              local_2b0[0] = *puVar17;
              local_2b0[1] = plVar13[3];
            }
            else {
              local_2b0[0] = *puVar17;
              _local_2c0 = (ulong *)*plVar13;
            }
            afStack_2bc._4_8_ = plVar13[1];
            *plVar13 = (long)puVar17;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            iVar8 = pBVar1->elemNdx;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            std::ostream::operator<<((ostringstream *)local_1b0,iVar8 + uVar29);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            std::ios_base::~ios_base(local_140);
            uVar24 = 0xf;
            if (_local_2c0 != local_2b0) {
              uVar24 = local_2b0[0];
            }
            if (uVar24 < local_330._M_string_length + afStack_2bc._4_8_) {
              uVar22 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                uVar22 = local_330.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar22 < local_330._M_string_length + afStack_2bc._4_8_) goto LAB_00f7d386;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_330,0,(char *)0x0,(ulong)_local_2c0);
            }
            else {
LAB_00f7d386:
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_2c0,(ulong)local_330._M_dataplus._M_p)
              ;
            }
            local_278 = &local_268;
            plVar13 = puVar14 + 2;
            if ((long *)*puVar14 == plVar13) {
              local_268 = *plVar13;
              uStack_260 = puVar14[3];
            }
            else {
              local_268 = *plVar13;
              local_278 = (long *)*puVar14;
            }
            local_270 = puVar14[1];
            *puVar14 = plVar13;
            puVar14[1] = 0;
            *(undefined1 *)plVar13 = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_278);
            local_308 = &local_2f8;
            plVar18 = plVar13 + 2;
            if ((long *)*plVar13 == plVar18) {
              local_2f8 = *plVar18;
              lStack_2f0 = plVar13[3];
            }
            else {
              local_2f8 = *plVar18;
              local_308 = (long *)*plVar13;
            }
            local_300 = plVar13[1];
            *plVar13 = (long)plVar18;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if (local_278 != &local_268) {
              operator_delete(local_278,local_268 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            if (_local_2c0 != local_2b0) {
              operator_delete(_local_2c0,local_2b0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_210[0]._M_dataplus._M_p._4_4_,local_210[0]._M_dataplus._M_p._0_4_)
                != &local_210[0].field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_210[0]._M_dataplus._M_p._4_4_,
                                       local_210[0]._M_dataplus._M_p._0_4_),
                              CONCAT44(local_210[0].field_2._M_allocated_capacity._4_4_,
                                       (undefined4)local_210[0].field_2._M_allocated_capacity) + 1);
            }
            pBVar19 = (basicUniforms->
                      super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pBVar12 = (basicUniforms->
                      super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            pBVar20 = pBVar19;
            if (pBVar19 == pBVar12) {
LAB_00f7d515:
              if (pBVar12 != pBVar19) goto LAB_00f7d51e;
            }
            else {
              do {
                iVar8 = std::__cxx11::string::compare((char *)pBVar20);
                pBVar19 = (basicUniforms->
                          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                pBVar12 = pBVar20;
                if (iVar8 == 0) goto LAB_00f7d515;
                pBVar20 = pBVar20 + 1;
              } while (pBVar20 != pBVar19);
            }
          }
LAB_00f7d8eb:
          if (local_308 != &local_2f8) {
            operator_delete(local_308,local_2f8 + 1);
          }
          pVVar5 = local_2d8.
                   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar28);
        DVar9 = (local_2d8.
                 super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_start)->type;
        if (DVar9 - TYPE_FLOAT < 4) {
          if (bVar16) {
            switch(iVar7) {
            case 1:
              glu::CallLogWrapper::glUniform1f
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x60a;
              pcVar23 = "glUniform1f(location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glUniform2f
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x60b;
              pcVar23 = "glUniform2f(location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glUniform3f
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x60c;
              pcVar23 = "glUniform3f(location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glUniform4f
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[3]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x60d;
              pcVar23 = "glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_00f7d953_default;
            }
            glu::checkError(dVar10,pcVar23,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,iVar7);
            goto switchD_00f7d953_default;
          }
          lVar31 = ((long)local_2d8.
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2d8.
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_1b0,iVar7 * lVar31,
                     (allocator_type *)&local_278);
          uVar28 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
          if (0 < (int)uVar28) {
            uVar24 = 0;
            do {
              uVar4 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
              *(float *)((long)(qpTestLog **)local_1b0 + uVar24 * 4) =
                   pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                   [(long)uVar4 % (long)iVar7 & 0xffffffff];
              uVar24 = uVar24 + 1;
            } while ((uVar28 & 0x7fffffff) != uVar24);
          }
          GVar30 = (GLsizei)lVar31;
          switch(iVar7) {
          case 1:
            glu::CallLogWrapper::glUniform1fv(this_00,location,GVar30,(GLfloat *)local_1b0);
            dVar10 = glu::CallLogWrapper::glGetError(this_00);
            iVar7 = 0x61b;
            pcVar23 = "glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 2:
            glu::CallLogWrapper::glUniform2fv(this_00,location,GVar30,(GLfloat *)local_1b0);
            dVar10 = glu::CallLogWrapper::glGetError(this_00);
            iVar7 = 0x61c;
            pcVar23 = "glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 3:
            glu::CallLogWrapper::glUniform3fv(this_00,location,GVar30,(GLfloat *)local_1b0);
            dVar10 = glu::CallLogWrapper::glGetError(this_00);
            iVar7 = 0x61d;
            pcVar23 = "glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 4:
            glu::CallLogWrapper::glUniform4fv(this_00,location,GVar30,(GLfloat *)local_1b0);
            dVar10 = glu::CallLogWrapper::glGetError(this_00);
            iVar7 = 0x61e;
            pcVar23 = "glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          default:
            goto switchD_00f7db13_default;
          }
          glu::checkError(dVar10,pcVar23,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,iVar7);
switchD_00f7db13_default:
          if (local_1b0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1b0,local_1a8._8_8_ - (long)local_1b0);
          }
        }
        else {
          if (DVar9 - TYPE_FLOAT_MAT2 < 9 || DVar9 - TYPE_DOUBLE_MAT2 < 9) {
            lVar31 = ((long)local_2d8.
                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2d8.
                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_1b0,iVar7 * lVar31,
                       (allocator_type *)&local_278);
            uVar28 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
            if (0 < (int)uVar28) {
              uVar24 = 0;
              do {
                uVar4 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
                *(float *)((long)(qpTestLog **)local_1b0 + uVar24 * 4) =
                     pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                     [(long)uVar4 % (long)iVar7 & 0xffffffff];
                uVar24 = uVar24 + 1;
              } while ((uVar28 & 0x7fffffff) != uVar24);
            }
            DVar9 = pBVar1->type;
            GVar30 = (GLsizei)lVar31;
            if (DVar9 == TYPE_FLOAT_MAT2) {
              glu::CallLogWrapper::glUniformMatrix2fv
                        (this_00,location,GVar30,'\0',(GLfloat *)local_1b0);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x62e;
              pcVar23 = 
              "glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
            }
            else if (DVar9 == TYPE_FLOAT_MAT3) {
              glu::CallLogWrapper::glUniformMatrix3fv
                        (this_00,location,GVar30,'\0',(GLfloat *)local_1b0);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x62f;
              pcVar23 = 
              "glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
            }
            else {
              if (DVar9 != TYPE_FLOAT_MAT4) goto switchD_00f7db13_default;
              glu::CallLogWrapper::glUniformMatrix4fv
                        (this_00,location,GVar30,'\0',(GLfloat *)local_1b0);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x630;
              pcVar23 = 
              "glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])";
            }
            glu::checkError(dVar10,pcVar23,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,iVar7);
            goto switchD_00f7db13_default;
          }
          if (DVar9 - TYPE_INT < 4) {
            if (!bVar16) {
              lVar31 = ((long)local_2d8.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2d8.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_1b0,iVar7 * lVar31,
                         (allocator_type *)&local_278);
              uVar28 = (uint)((ulong)(local_1a8._0_8_ - (long)local_1b0) >> 2);
              if (0 < (int)uVar28) {
                uVar24 = 0;
                do {
                  uVar4 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
                  *(float *)((long)(qpTestLog **)local_1b0 + uVar24 * 4) =
                       pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                       [(long)uVar4 % (long)iVar7 & 0xffffffff];
                  uVar24 = uVar24 + 1;
                } while ((uVar28 & 0x7fffffff) != uVar24);
              }
              GVar30 = (GLsizei)lVar31;
              switch(iVar7) {
              case 1:
                glu::CallLogWrapper::glUniform1iv(this_00,location,GVar30,(GLint *)local_1b0);
                dVar10 = glu::CallLogWrapper::glGetError(this_00);
                iVar7 = 0x64e;
                pcVar23 = "glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              case 2:
                glu::CallLogWrapper::glUniform2iv(this_00,location,GVar30,(GLint *)local_1b0);
                dVar10 = glu::CallLogWrapper::glGetError(this_00);
                iVar7 = 0x64f;
                pcVar23 = "glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              case 3:
                glu::CallLogWrapper::glUniform3iv(this_00,location,GVar30,(GLint *)local_1b0);
                dVar10 = glu::CallLogWrapper::glGetError(this_00);
                iVar7 = 0x650;
                pcVar23 = "glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              case 4:
                glu::CallLogWrapper::glUniform4iv(this_00,location,GVar30,(GLint *)local_1b0);
                dVar10 = glu::CallLogWrapper::glGetError(this_00);
                iVar7 = 0x651;
                pcVar23 = "glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])";
                break;
              default:
                goto switchD_00f7db13_default;
              }
              glu::checkError(dVar10,pcVar23,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,iVar7);
              goto switchD_00f7db13_default;
            }
            switch(iVar7) {
            case 1:
              glu::CallLogWrapper::glUniform1i
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x63d;
              pcVar23 = "glUniform1i(location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glUniform2i
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x63e;
              pcVar23 = "glUniform2i(location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glUniform3i
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x63f;
              pcVar23 = "glUniform3i(location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glUniform4i
                        (this_00,location,
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2],
                         ((local_2d8.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[3]);
              dVar10 = glu::CallLogWrapper::glGetError(this_00);
              iVar7 = 0x640;
              pcVar23 = "glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_00f7d953_default;
            }
            glu::checkError(dVar10,pcVar23,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,iVar7);
          }
          else if (DVar9 - TYPE_SAMPLER_1D < 0x1e) {
            if (bVar16) {
              glu::CallLogWrapper::glUniform1i(this_00,location,(pBVar1->finalValue).val.intV[0]);
              GVar11 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar11,"glUniform1i(location, uniform.finalValue.val.samplerV.unit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x65a);
            }
            else {
              local_1b0._0_4_ = (pBVar1->finalValue).val.intV[0];
              glu::CallLogWrapper::glUniform1iv
                        (this_00,location,
                         (int)((ulong)((long)local_2d8.
                                             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2d8.
                                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                         -0xf0f0f0f,(GLint *)local_1b0);
              GVar11 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar11,"glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                              ,0x65e);
            }
          }
        }
switchD_00f7d953_default:
        operator_delete(pVVar5,(long)local_2d8.
                                     super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pVVar5);
      }
      else {
        std::__cxx11::string::rfind((char)pBVar1,0x5b);
        std::__cxx11::string::substr((ulong)local_230,(ulong)pBVar1);
LAB_00f7d095:
        uVar29 = *(uint *)&(local_310->super_CallLogWrapper).field_0x14;
        if ((uVar29 & 4) == 0) {
          uVar28 = 1;
          if ((uVar29 & 8) != 0) {
            uVar28 = ~pBVar1->elemNdx * 2 & 2;
            goto LAB_00f7d0d6;
          }
          goto LAB_00f7d16e;
        }
        if (pBVar1->elemNdx == 0) {
          uVar28 = pBVar1->rootSize;
LAB_00f7d0d6:
          if (uVar28 != 0) goto LAB_00f7d16e;
        }
        local_1b0 = (undefined1  [8])local_2e8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"// Uniform ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pBVar1->name)._M_dataplus._M_p,
                   (pBVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " is covered by another glUniform*v() call to the same array",0x3b);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      local_1c8 = local_1c8 + 1;
      pBVar12 = (basicUniforms->
                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (local_1c8 <
             (int)((ulong)((long)(basicUniforms->
                                 super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3)
             * 0x286bca1b);
  }
  return;
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1f(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2f(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3f(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4f(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4fv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2: GLU_CHECK_CALL(glUniformMatrix2fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3: GLU_CHECK_CALL(glUniformMatrix3fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4: GLU_CHECK_CALL(glUniformMatrix4fv(location, (GLsizei)valuesToAssign.size(), GL_FALSE, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1i(location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glUniform2i(location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glUniform3i(location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glUniform4i(location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glUniform2iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glUniform3iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glUniform4iv(location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glUniform1i(location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glUniform1iv(location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}